

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O3

IterateResult __thiscall deqp::TestSubcase::iterate(TestSubcase *this)

{
  long *plVar1;
  int *piVar2;
  ostringstream *this_00;
  TestLog *this_01;
  int iVar3;
  int value;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  IterateResult IVar8;
  qpTestResult testResult;
  int iVar9;
  long lVar10;
  bool bVar11;
  SubcaseBasePtr subcase;
  SubcaseBase *local_1c0;
  long *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  deqp::(anonymous_namespace)::current_context = (this->super_TestCase).m_context;
  this_01 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (*this->m_factoryFunc)(&local_1c0);
  SubcaseBase::Documentation(local_1c0);
  (local_1c0->super_GLWrapper).super_CallLogWrapper.m_enableLog = true;
  iVar3 = (*(local_1c0->super_GLWrapper)._vptr_GLWrapper[3])();
  lVar10 = CONCAT44(extraout_var,iVar3);
  if (lVar10 == 0) {
    iVar3 = (*(local_1c0->super_GLWrapper)._vptr_GLWrapper[2])();
    lVar10 = CONCAT44(extraout_var_00,iVar3);
    if (lVar10 == -1) {
      lVar10 = -1;
      tcu::TestLog::writeMessage(this_01,"Test Run() failed");
    }
  }
  else if (lVar10 == -1) {
    lVar10 = -1;
    tcu::TestLog::writeMessage(this_01,"Test Setup() failed");
  }
  iVar3 = (*(local_1c0->super_GLWrapper)._vptr_GLWrapper[4])();
  if (CONCAT44(extraout_var_01,iVar3) == -1) {
    lVar10 = -1;
    tcu::TestLog::writeMessage(this_01,"Test Cleanup() failed");
  }
  (local_1c0->super_GLWrapper).super_CallLogWrapper.m_enableLog = false;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  value = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
  iVar9 = 99;
  do {
    iVar4 = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
    bVar11 = iVar9 != 0;
    iVar9 = iVar9 + -1;
    if (iVar4 == 0) break;
  } while (bVar11);
  if (value == 0) {
    if (lVar10 == -1) goto LAB_00dd4c8c;
    if (lVar10 != 0x10) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      piVar2 = &this->m_iterationCount;
      *piVar2 = *piVar2 + -1;
      IVar8 = (IterateResult)(*piVar2 != 0);
      goto LAB_00dd4ca3;
    }
    pcVar7 = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    pcVar5 = glu::getErrorName(value);
    pcVar7 = "UNKNOWN ERROR";
    if (pcVar5 != (char *)0x0) {
      pcVar7 = pcVar5;
    }
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_01;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"After test execution glGetError() returned: ",0x2c);
    sVar6 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,sVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,", forcing FAIL for subcase",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
LAB_00dd4c8c:
    pcVar7 = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  IVar8 = STOP;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar7);
LAB_00dd4ca3:
  if (local_1b8 != (long *)0x0) {
    LOCK();
    plVar1 = local_1b8 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      local_1c0 = (SubcaseBase *)0x0;
      (**(code **)(*local_1b8 + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)local_1b8 + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) && (local_1b8 != (long *)0x0)) {
      (**(code **)(*local_1b8 + 8))();
    }
  }
  return IVar8;
}

Assistant:

TestSubcase::IterateResult TestSubcase::iterate(void)
{
	current_context = &m_context;
	using namespace std;
	using tcu::TestLog;
	TestLog& log = m_testCtx.getLog();

	SubcaseBase::SubcaseBasePtr subcase = m_factoryFunc();
	subcase->Documentation();
	subcase->enableLogging(true);
	//Run subcase
	long subError = NO_ERROR;
	// test case setup
	try
	{
		subError = subcase->Setup();
		if (subError == ERROR)
			log.writeMessage("Test Setup() failed");
	}
	catch (const runtime_error& ex)
	{
		log.writeMessage(ex.what());
		subError = ERROR;
	}
	catch (...)
	{
		log.writeMessage("Undefined exception.");
		subError = ERROR;
	}

	// test case run
	if (subError == NO_ERROR)
	{
		try
		{
			subError = subcase->Run();
			if (subError == ERROR)
				log.writeMessage("Test Run() failed");
		}
		catch (const runtime_error& ex)
		{
			log.writeMessage(ex.what());
			subError = ERROR;
		}
		catch (...)
		{
			log.writeMessage("Undefined exception.");
			subError = ERROR;
		}
	}

	// test case cleanup
	try
	{
		if (subcase->Cleanup() == ERROR)
		{
			subError = ERROR;
			log.writeMessage("Test Cleanup() failed");
		}
	}
	catch (const runtime_error& ex)
	{
		log.writeMessage(ex.what());
		subError = ERROR;
	}
	catch (...)
	{
		log.writeMessage("Undefined exception.");
		subError = ERROR;
	}
	subcase->enableLogging(false);

	//check gl error state
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	glw::GLenum			  glError = gl.getError();
	for (int i = 0; i < 100 && gl.getError(); ++i)
		;
	if (glError != GL_NO_ERROR)
	{
		const char* name = glu::getErrorName(glError);
		if (name == DE_NULL)
			name = "UNKNOWN ERROR";
		log << TestLog::Message << "After test execution glGetError() returned: " << name
			<< ", forcing FAIL for subcase" << TestLog::EndMessage;
		subError = ERROR;
	}

	if (subError == ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}
	else if (subError == NOT_SUPPORTED)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	if (--m_iterationCount)
		return CONTINUE;
	else
		return STOP;
}